

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O0

void __thiscall
HawkTracer::parser::KlassRegister::_add_klass
          (KlassRegister *this,
          unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
          *klass)

{
  bool bVar1;
  pointer pEVar2;
  undefined1 local_5c [20];
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_false>
  local_48 [3];
  uint32_t local_2c;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_false>
  local_28;
  lock_guard<std::mutex> local_20;
  lock_guard l;
  unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
  *klass_local;
  KlassRegister *this_local;
  
  l._M_device = (mutex_type *)klass;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_register_mtx);
  pEVar2 = std::
           unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ::operator->(klass);
  local_2c = EventKlass::get_id(pEVar2);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>_>
       ::find(&this->_register,&local_2c);
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>_>
       ::end(&this->_register);
  bVar1 = std::__detail::operator==(&local_28,local_48);
  if (bVar1) {
    pEVar2 = std::
             unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
             ::operator->(klass);
    local_5c._0_4_ = EventKlass::get_id(pEVar2);
    std::
    make_pair<unsigned_int,std::unique_ptr<HawkTracer::parser::EventKlass,std::default_delete<HawkTracer::parser::EventKlass>>>
              ((uint *)(local_5c + 4),
               (unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
                *)local_5c);
    std::
    unordered_map<unsigned_int,std::shared_ptr<HawkTracer::parser::EventKlass>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<HawkTracer::parser::EventKlass>>>>
    ::
    insert<std::pair<unsigned_int,std::unique_ptr<HawkTracer::parser::EventKlass,std::default_delete<HawkTracer::parser::EventKlass>>>>
              ((unordered_map<unsigned_int,std::shared_ptr<HawkTracer::parser::EventKlass>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<HawkTracer::parser::EventKlass>>>>
                *)&this->_register,
               (pair<unsigned_int,_std::unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>_>
                *)(local_5c + 4));
    std::
    pair<unsigned_int,_std::unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>_>
    ::~pair((pair<unsigned_int,_std::unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>_>
             *)(local_5c + 4));
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void KlassRegister::_add_klass(std::unique_ptr<EventKlass> klass)
{
    lock_guard l(_register_mtx);
    if (_register.find(klass->get_id()) == _register.end())
    {
        _register.insert(std::make_pair(klass->get_id(), std::move(klass)));
    }
}